

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

HandlePtr dg::vr::RelationsAnalyzer::getCorrespondingByFrom
                    (ValueRelations *toRels,ValueRelations *fromRels,Handle h)

{
  pointer prVar1;
  HandlePtr mVal;
  Relations *rels;
  HandlePtr pBVar2;
  Bucket *pBVar3;
  _Base_bitset<1UL> local_58;
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  local_50;
  
  local_58._M_w = 0;
  rels = Relations::pf((Relations *)&local_58);
  ValueRelations::getRelated<dg::vr::Bucket>((RelationsMap *)&local_50,fromRels,h,rels);
  if (local_50._M_impl.super__Rb_tree_header._M_node_count == 1) {
    pBVar2 = getCorrespondingByContent
                       (toRels,fromRels,
                        *(Handle *)(local_50._M_impl.super__Rb_tree_header._M_header._M_left + 1));
    if ((pBVar2 != (HandlePtr)0x0) &&
       (prVar1 = (pBVar2->relatedBuckets)._M_elems[10].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       prVar1 != (pBVar2->relatedBuckets)._M_elems[10].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      pBVar3 = prVar1->_M_data;
      goto LAB_00135658;
    }
  }
  pBVar3 = (Bucket *)0x0;
LAB_00135658:
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~_Rb_tree(&local_50);
  return pBVar3;
}

Assistant:

RelationsAnalyzer::HandlePtr
RelationsAnalyzer::getCorrespondingByFrom(const ValueRelations &toRels,
                                          const ValueRelations &fromRels,
                                          Handle h) {
    const auto &froms = fromRels.getRelated(h, Relations().pf());
    if (froms.size() != 1)
        return nullptr;

    const auto &fromFromH = froms.begin()->first;
    const auto *toFromH =
            getCorrespondingByContent(toRels, fromRels, fromFromH);
    if (!toFromH)
        return nullptr;

    if (!toRels.has(*toFromH, Relations::PT))
        return nullptr;

    return &toRels.getPointedTo(*toFromH);
}